

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O3

void X86_Intel_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  char cVar2;
  cs_detail *pcVar3;
  cs_struct *h;
  _Bool _Var4;
  uint uVar5;
  x86_reg xVar6;
  MCOperand *pMVar7;
  int64_t iVar8;
  MCRegisterClass *c;
  char *s;
  MCRegisterInfo *extraout_RDX;
  MCRegisterInfo *extraout_RDX_00;
  MCRegisterInfo *extraout_RDX_01;
  MCRegisterInfo *extraout_RDX_02;
  MCRegisterInfo *extraout_RDX_03;
  MCRegisterInfo *extraout_RDX_04;
  MCRegisterInfo *extraout_RDX_05;
  MCRegisterInfo *extraout_RDX_06;
  MCRegisterInfo *extraout_RDX_07;
  MCRegisterInfo *extraout_RDX_08;
  MCRegisterInfo *extraout_RDX_09;
  MCRegisterInfo *extraout_RDX_10;
  MCRegisterInfo *extraout_RDX_11;
  MCRegisterInfo *extraout_RDX_12;
  MCRegisterInfo *extraout_RDX_13;
  MCRegisterInfo *pMVar9;
  MCRegisterInfo *extraout_RDX_14;
  char *pcVar10;
  char *pcVar11;
  cs_ac_type access1;
  x86_reg reg;
  uint8_t access [6];
  cs_ac_type access2;
  x86_reg reg2;
  undefined1 local_48 [4];
  x86_reg local_44;
  uint8_t local_40 [8];
  undefined1 local_38 [4];
  x86_reg local_34;
  
  if (MI->assembly[0] != '\0') {
    strncpy(O->buffer,MI->assembly,0x200);
    return;
  }
  uVar5 = MCInst_getOpcode(MI);
  pMVar9 = extraout_RDX;
  if ((int)uVar5 < 0x272) {
    if (uVar5 == 0x17) {
      uVar5 = MCInst_getNumOperands(MI);
      pMVar9 = extraout_RDX_04;
      if (uVar5 == 1) {
        pMVar7 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isImm(pMVar7);
        pMVar9 = extraout_RDX_05;
        if (_Var4) {
          pMVar7 = MCInst_getOperand(MI,0);
          iVar8 = MCOperand_getImm(pMVar7);
          pMVar9 = extraout_RDX_06;
          if (iVar8 == 10) {
            pcVar10 = "aad";
            goto LAB_00234db1;
          }
        }
      }
    }
    else if ((uVar5 == 0x18) &&
            (uVar5 = MCInst_getNumOperands(MI), pMVar9 = extraout_RDX_00, uVar5 == 1)) {
      pMVar7 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isImm(pMVar7);
      pMVar9 = extraout_RDX_01;
      if (_Var4) {
        pMVar7 = MCInst_getOperand(MI,0);
        iVar8 = MCOperand_getImm(pMVar7);
        pMVar9 = extraout_RDX_02;
        if (iVar8 == 10) {
          pcVar10 = "aam";
          goto LAB_00234db1;
        }
      }
    }
  }
  else if (uVar5 == 0x272) {
    uVar5 = MCInst_getNumOperands(MI);
    pMVar9 = extraout_RDX_07;
    if (uVar5 == 6) {
      pMVar7 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isReg(pMVar7);
      pMVar9 = extraout_RDX_08;
      if (_Var4) {
        c = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,0x2a);
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        _Var4 = MCRegisterClass_contains(c,uVar5);
        pMVar9 = extraout_RDX_09;
        if (_Var4) {
          pcVar10 = anon_var_dwarf_3dafcb;
          goto LAB_00234db1;
        }
      }
    }
  }
  else if ((uVar5 == 0x2291) &&
          (uVar5 = MCInst_getNumOperands(MI), pMVar9 = extraout_RDX_03, uVar5 == 0)) {
    pcVar10 = "xstorerng";
LAB_00234db1:
    s = cs_strdup(pcVar10);
    for (pcVar10 = s; cVar2 = *pcVar10, cVar2 != '\0'; pcVar10 = pcVar10 + 1) {
      if ((cVar2 == ' ') || (cVar2 == '\t')) {
        *pcVar10 = '\0';
        pcVar10 = pcVar10 + 1;
        break;
      }
    }
    SStream_concat0(O,s);
    pMVar9 = extraout_RDX_10;
    if (*pcVar10 != '\0') {
      SStream_concat0(O,anon_var_dwarf_3465dd + 0x11);
      pMVar9 = extraout_RDX_11;
      do {
        cVar2 = *pcVar10;
        if (cVar2 == '$') {
          if (pcVar10[1] == -1) {
            pcVar11 = pcVar10 + 3;
            if (pcVar10[3] == '\x01') {
              cVar2 = pcVar10[2];
              SStream_concat0(O,"qword ptr ");
              MI->x86opsize = '\b';
              printMemReference(MI,(int)cVar2 - 1,O);
              pMVar9 = extraout_RDX_14;
            }
          }
          else {
            pcVar11 = pcVar10 + 1;
            printOperand(MI,(int)pcVar10[1] - 1,O);
            pMVar9 = extraout_RDX_13;
          }
        }
        else {
          if (cVar2 == '\0') break;
          SStream_concat(O,"%c",(ulong)(uint)(int)cVar2);
          pMVar9 = extraout_RDX_12;
          pcVar11 = pcVar10;
        }
        pcVar10 = pcVar11 + 1;
      } while( true );
    }
    if (s != (char *)0x0) {
      (*cs_mem_free)(s);
      goto LAB_00234ea0;
    }
  }
  printInstruction(MI,O,pMVar9);
LAB_00234ea0:
  uVar5 = MCInst_getOpcode(MI);
  xVar6 = X86_insn_reg_intel(uVar5,(cs_ac_type *)local_48);
  local_44 = xVar6;
  if (MI->csh->detail != CS_OPT_OFF) {
    local_40[4] = '\0';
    local_40[5] = '\0';
    local_40[0] = '\0';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    if (xVar6 == X86_REG_INVALID) {
      uVar5 = MCInst_getOpcode(MI);
      _Var4 = X86_insn_reg_intel2(uVar5,&local_44,(cs_ac_type *)local_48,&local_34,
                                  (cs_ac_type *)local_38);
      if (_Var4) {
        (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
        (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = local_44;
        *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x68) = MI->csh->regsize_map[local_44];
        *(undefined1 *)((long)&MI->flat_insn->detail->field_6 + 0x69) = local_48[0];
        (MI->flat_insn->detail->field_6).x86.operands[1].type = X86_OP_REG;
        (MI->flat_insn->detail->field_6).x86.operands[1].field_1.reg = local_34;
        *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x98) = MI->csh->regsize_map[local_34];
        *(undefined1 *)((long)&MI->flat_insn->detail->field_6 + 0x99) = local_38[0];
        (MI->flat_insn->detail->field_6).x86.op_count = '\x02';
      }
    }
    else {
      pcVar3 = MI->flat_insn->detail;
      memmove((void *)((long)&pcVar3->field_6 + 0x78),(void *)((long)&pcVar3->field_6 + 0x48),0x150)
      ;
      (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
      (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = xVar6;
      *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x68) = MI->csh->regsize_map[xVar6];
      *(undefined1 *)((long)&MI->flat_insn->detail->field_6 + 0x69) = local_48[0];
      puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
    h = MI->csh;
    uVar5 = MCInst_getOpcode(MI);
    get_op_access(h,uVar5,local_40,&(MI->flat_insn->detail->field_6).x86.field_15.eflags);
    *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x69) = local_40[0];
    *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x99) = local_40[1];
  }
  if (local_44 != X86_REG_INVALID && MI->op1_size == '\0') {
    MI->op1_size = MI->csh->regsize_map[local_44];
  }
  return;
}

Assistant:

void X86_Intel_printInst(MCInst *MI, SStream *O, void *Info)
{
#ifndef CAPSTONE_DIET
	char *mnem;
#endif
	x86_reg reg, reg2;
	enum cs_ac_type access1, access2;

	// perhaps this instruction does not need printer
	if (MI->assembly[0]) {
		strncpy(O->buffer, MI->assembly, sizeof(O->buffer));
		return;
	}

#ifndef CAPSTONE_DIET
	// Try to print any aliases first.
	mnem = printAliasInstr(MI, O, Info);
	if (mnem)
		cs_mem_free(mnem);
	else
#endif
		printInstruction(MI, O, Info);

	reg = X86_insn_reg_intel(MCInst_getOpcode(MI), &access1);
	if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
		uint8_t access[6] = {0};
#endif

		// first op can be embedded in the asm by llvm.
		// so we have to add the missing register as the first operand
		if (reg) {
			// shift all the ops right to leave 1st slot for this new register op
			memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
					sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
			MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
			MI->flat_insn->detail->x86.operands[0].reg = reg;
			MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
			MI->flat_insn->detail->x86.operands[0].access = access1;
			MI->flat_insn->detail->x86.op_count++;
		} else {
			if (X86_insn_reg_intel2(MCInst_getOpcode(MI), &reg, &access1, &reg2, &access2)) {
				MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[0].reg = reg;
				MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.operands[0].access = access1;
				MI->flat_insn->detail->x86.operands[1].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[1].reg = reg2;
				MI->flat_insn->detail->x86.operands[1].size = MI->csh->regsize_map[reg2];
				MI->flat_insn->detail->x86.operands[1].access = access2;
				MI->flat_insn->detail->x86.op_count = 2;
			}
		}

#ifndef CAPSTONE_DIET
		get_op_access(MI->csh, MCInst_getOpcode(MI), access, &MI->flat_insn->detail->x86.eflags);
		MI->flat_insn->detail->x86.operands[0].access = access[0];
		MI->flat_insn->detail->x86.operands[1].access = access[1];
#endif
	}

	if (MI->op1_size == 0 && reg)
		MI->op1_size = MI->csh->regsize_map[reg];
}